

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

int __thiscall
basist::basisu_transcoder::find_first_slice_index
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t image_index,
          uint32_t level_index)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = (long)pData + 1;
  uVar1 = 0;
  while( true ) {
    if (*(uint3 *)((long)pData + 0xe) <= uVar1) {
      return -1;
    }
    uVar3 = (ulong)*(uint *)((long)pData + 0x41);
    if ((CONCAT21(*(undefined2 *)(lVar2 + uVar3),*(undefined1 *)(lVar2 + -1 + uVar3)) == image_index
        ) && (*(byte *)(lVar2 + 2 + uVar3) == level_index)) break;
    uVar1 = uVar1 + 1;
    lVar2 = lVar2 + 0x17;
  }
  return (int)uVar1;
}

Assistant:

int basisu_transcoder::find_first_slice_index(const void* pData, uint32_t data_size, uint32_t image_index, uint32_t level_index) const
	{
		BASISU_NOTE_UNUSED(data_size);

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);
		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);

		// For very large basis files this search could be painful
		// TODO: Binary search this
		for (uint32_t slice_iter = 0; slice_iter < pHeader->m_total_slices; slice_iter++)
		{
			const basis_slice_desc& slice_desc = reinterpret_cast<const basis_slice_desc*>(pDataU8 + pHeader->m_slice_desc_file_ofs)[slice_iter];
			if ((slice_desc.m_image_index == image_index) && (slice_desc.m_level_index == level_index))
				return slice_iter;
		}

		BASISU_DEVEL_ERROR("basisu_transcoder::find_first_slice_index: didn't find slice\n");

		return -1;
	}